

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

void __thiscall CGL::Matrix3x3::operator/=(Matrix3x3 *this,double x)

{
  Vector3D *pVVar1;
  Matrix3x3 *in_RDI;
  double in_XMM0_Qa;
  double rx;
  Matrix3x3 *A;
  double local_20;
  Matrix3x3 *local_18;
  
  local_20 = 1.0 / in_XMM0_Qa;
  local_18 = in_RDI;
  pVVar1 = operator[](in_RDI,0);
  Vector3D::operator*=(pVVar1,&local_20);
  pVVar1 = operator[](local_18,1);
  Vector3D::operator*=(pVVar1,&local_20);
  pVVar1 = operator[](local_18,2);
  Vector3D::operator*=(pVVar1,&local_20);
  return;
}

Assistant:

void Matrix3x3::operator/=( double x ) {
    Matrix3x3& A( *this );
    double rx = 1./x;

    A[0] *= rx;
    A[1] *= rx;
    A[2] *= rx;
  }